

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O0

void __thiscall SVGChart::PlotDataContainer::ClearData(PlotDataContainer *this)

{
  PlotDataBase *pPVar1;
  PlotDataBase *pPVar2;
  LegendData *this_00;
  DataDrawerBase *pDVar3;
  PlotDataSelection *this_01;
  bool bVar4;
  reference ppPVar5;
  reference ppLVar6;
  reference ppDVar7;
  reference ppPVar8;
  bool local_b9;
  PlotDataSelection *theP;
  DataDrawerBase *theD;
  LegendData *theL;
  PlotDataBase *theY;
  PlotDataBase *theX;
  __normal_iterator<SVGChart::DataDrawerBase_**,_std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>_>
  local_58;
  __normal_iterator<SVGChart::LegendData_**,_std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>_>
  local_50;
  __normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
  local_48;
  __normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
  local_40;
  __normal_iterator<SVGChart::PlotDataSelection_**,_std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>_>
  local_38;
  iterator thePI;
  iterator theDI;
  iterator theLI;
  iterator theYI;
  iterator theXI;
  PlotDataContainer *this_local;
  
  theYI = std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::begin
                    (&this->mXDataList);
  theLI._M_current =
       (LegendData **)
       std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::begin
                 (&this->mYDataList);
  theDI._M_current =
       (DataDrawerBase **)
       std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::begin
                 (&this->mLegendDataList);
  thePI._M_current =
       (PlotDataSelection **)
       std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>::begin
                 (&this->mDataDrawerList);
  local_38._M_current =
       (PlotDataSelection **)
       std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>::
       begin(&this->mPlotDataSelectionList);
  while( true ) {
    local_40._M_current =
         (PlotDataBase **)
         std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::end
                   (&this->mXDataList);
    bVar4 = __gnu_cxx::operator!=(&theYI,&local_40);
    local_b9 = false;
    if (bVar4) {
      local_48._M_current =
           (PlotDataBase **)
           std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::end
                     (&this->mYDataList);
      bVar4 = __gnu_cxx::operator!=
                        ((__normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
                          *)&theLI,&local_48);
      local_b9 = false;
      if (bVar4) {
        local_50._M_current =
             (LegendData **)
             std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::end
                       (&this->mLegendDataList);
        bVar4 = __gnu_cxx::operator!=
                          ((__normal_iterator<SVGChart::LegendData_**,_std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>_>
                            *)&theDI,&local_50);
        local_b9 = false;
        if (bVar4) {
          local_58._M_current =
               (DataDrawerBase **)
               std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>
               ::end(&this->mDataDrawerList);
          bVar4 = __gnu_cxx::operator!=
                            ((__normal_iterator<SVGChart::DataDrawerBase_**,_std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>_>
                              *)&thePI,&local_58);
          local_b9 = false;
          if (bVar4) {
            theX = (PlotDataBase *)
                   std::
                   vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>
                   ::end(&this->mPlotDataSelectionList);
            local_b9 = __gnu_cxx::operator!=
                                 (&local_38,
                                  (__normal_iterator<SVGChart::PlotDataSelection_**,_std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>_>
                                   *)&theX);
          }
        }
      }
    }
    if (local_b9 == false) break;
    ppPVar5 = __gnu_cxx::
              __normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
              ::operator*(&theYI);
    pPVar1 = *ppPVar5;
    ppPVar5 = __gnu_cxx::
              __normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
              ::operator*((__normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
                           *)&theLI);
    pPVar2 = *ppPVar5;
    ppLVar6 = __gnu_cxx::
              __normal_iterator<SVGChart::LegendData_**,_std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>_>
              ::operator*((__normal_iterator<SVGChart::LegendData_**,_std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>_>
                           *)&theDI);
    this_00 = *ppLVar6;
    ppDVar7 = __gnu_cxx::
              __normal_iterator<SVGChart::DataDrawerBase_**,_std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>_>
              ::operator*((__normal_iterator<SVGChart::DataDrawerBase_**,_std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>_>
                           *)&thePI);
    pDVar3 = *ppDVar7;
    ppPVar8 = __gnu_cxx::
              __normal_iterator<SVGChart::PlotDataSelection_**,_std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>_>
              ::operator*(&local_38);
    this_01 = *ppPVar8;
    if (pPVar1 != (PlotDataBase *)0x0) {
      (*pPVar1->_vptr_PlotDataBase[1])();
    }
    if (pPVar2 != (PlotDataBase *)0x0) {
      (*pPVar2->_vptr_PlotDataBase[1])();
    }
    if (this_00 != (LegendData *)0x0) {
      LegendData::~LegendData(this_00);
      operator_delete(this_00,0xa8);
    }
    if (pDVar3 != (DataDrawerBase *)0x0) {
      (*pDVar3->_vptr_DataDrawerBase[1])();
    }
    if (this_01 != (PlotDataSelection *)0x0) {
      PlotDataSelection::~PlotDataSelection(this_01);
      operator_delete(this_01,0x18);
    }
    __gnu_cxx::
    __normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
    ::operator++(&theYI,0);
    __gnu_cxx::
    __normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
    ::operator++((__normal_iterator<SVGChart::PlotDataBase_**,_std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>_>
                  *)&theLI,0);
    __gnu_cxx::
    __normal_iterator<SVGChart::LegendData_**,_std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>_>
    ::operator++((__normal_iterator<SVGChart::LegendData_**,_std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>_>
                  *)&theDI,0);
    __gnu_cxx::
    __normal_iterator<SVGChart::DataDrawerBase_**,_std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>_>
    ::operator++((__normal_iterator<SVGChart::DataDrawerBase_**,_std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>_>
                  *)&thePI,0);
    __gnu_cxx::
    __normal_iterator<SVGChart::PlotDataSelection_**,_std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>_>
    ::operator++(&local_38,0);
  }
  std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::clear
            (&this->mXDataList);
  std::vector<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>::clear
            (&this->mYDataList);
  std::vector<SVGChart::LegendData_*,_std::allocator<SVGChart::LegendData_*>_>::clear
            (&this->mLegendDataList);
  std::vector<SVGChart::DataDrawerBase_*,_std::allocator<SVGChart::DataDrawerBase_*>_>::clear
            (&this->mDataDrawerList);
  std::vector<SVGChart::PlotDataSelection_*,_std::allocator<SVGChart::PlotDataSelection_*>_>::clear
            (&this->mPlotDataSelectionList);
  return;
}

Assistant:

void PlotDataContainer::ClearData () {
      PlotDataList::iterator theXI = mXDataList.begin ();
      PlotDataList::iterator theYI = mYDataList.begin ();
      LegendDataList::iterator theLI = mLegendDataList.begin ();
      DataDrawerList::iterator theDI = mDataDrawerList.begin ();
      PlotDataSelectionList::iterator thePI = mPlotDataSelectionList.begin ();

      for (;theXI!=mXDataList.end () && theYI!=mYDataList.end () && theLI!=mLegendDataList.end () && theDI != mDataDrawerList.end () && thePI != mPlotDataSelectionList.end ();) {
        PlotDataBase *theX = *theXI;
        PlotDataBase *theY = *theYI;
        LegendData *theL = *theLI;
        DataDrawerBase *theD = *theDI;
        PlotDataSelection *theP = *thePI;

        delete theX;
        delete theY;
        delete theL;
        delete theD;
        delete theP;

        theXI++;
        theYI++;
        theLI++;
        theDI++;
        thePI++;
      }
      mXDataList.clear ();
      mYDataList.clear ();
      mLegendDataList.clear ();
      mDataDrawerList.clear ();
      mPlotDataSelectionList.clear ();
    }